

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O2

string * __thiscall
duckdb::Varint::VarcharToVarInt_abi_cxx11_
          (string *__return_storage_ptr__,Varint *this,string_t *value)

{
  pointer pcVar1;
  double dVar2;
  bool bVar3;
  ConversionException *this_00;
  pointer puVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  idx_t iVar8;
  long lVar9;
  Varint *pVVar10;
  Varint *pVVar11;
  idx_t iVar12;
  undefined1 auVar13 [16];
  bool is_zero;
  bool is_negative;
  string *local_a8;
  idx_t start_pos;
  unsafe_vector<uint64_t> digits;
  unsigned_long_long local_80;
  idx_t end_pos;
  string current_number;
  string local_50;
  
  bVar3 = VarcharFormatting((string_t *)this,&start_pos,&end_pos,&is_negative,&is_zero);
  if (!bVar3) {
    this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&current_number,"Could not convert string \'%s\' to Varint",
               (allocator *)&digits);
    string_t::GetString_abi_cxx11_(&local_50,(string_t *)this);
    ConversionException::ConversionException<std::__cxx11::string>
              (this_00,&current_number,&local_50);
    __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (is_zero == true) {
    InitializeVarintZero_abi_cxx11_();
  }
  else {
    if (*(uint *)this < 0xd) {
      pVVar11 = this + 4;
    }
    else {
      pVVar11 = *(Varint **)(this + 8);
    }
    lVar6 = end_pos - start_pos;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_a8 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x03');
    digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auVar13._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar13._0_8_ = lVar6;
    auVar13._12_4_ = 0x45300000;
    digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dVar2 = ceil(((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * 0.0625);
    uVar7 = (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f | (long)dVar2;
    pVVar10 = pVVar11 + end_pos;
    iVar12 = end_pos;
    while( true ) {
      __return_storage_ptr__ = local_a8;
      iVar12 = iVar12 - 0x10;
      bVar3 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar3) break;
      iVar8 = start_pos;
      if ((long)start_pos <= (long)iVar12) {
        iVar8 = iVar12;
      }
      current_number._M_dataplus._M_p = (pointer)&current_number.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&current_number,pVVar11 + iVar8,pVVar10);
      local_80 = ::std::__cxx11::stoull(&current_number,(size_t *)0x0,10);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&digits,&local_80);
      ::std::__cxx11::string::~string((string *)&current_number);
      pVVar10 = pVVar10 + -0x10;
    }
    while (digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      uVar7 = 0;
      puVar4 = digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar6 = (long)digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      while (lVar9 = lVar6, lVar6 = lVar9 + -1, lVar9 != 0) {
        dVar2 = (double)((uint)uVar7 & 0xff) * 1e+16;
        uVar7 = (ulong)dVar2;
        uVar7 = ((long)(dVar2 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) +
                digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] = uVar7 >> 8;
        if ((uVar7 < 0x100) &&
           (lVar9 == (long)puVar4 -
                     (long)digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3)) {
          puVar4 = puVar4 + -1;
          digits.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar4;
        }
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    ::std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (pcVar1 + 3,pcVar1 + __return_storage_ptr__->_M_string_length);
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar5 = -(uint)is_negative ^ ((int)__return_storage_ptr__->_M_string_length - 3U | 0x800000);
    *pcVar1 = (char)(uVar5 >> 0x10);
    pcVar1[1] = (char)(uVar5 >> 8);
    pcVar1[2] = (char)uVar5;
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&digits);
  }
  return __return_storage_ptr__;
}

Assistant:

string Varint::VarcharToVarInt(const string_t &value) {
	idx_t start_pos, end_pos;
	bool is_negative, is_zero;
	if (!VarcharFormatting(value, start_pos, end_pos, is_negative, is_zero)) {
		throw ConversionException("Could not convert string \'%s\' to Varint", value.GetString());
	}
	if (is_zero) {
		// Return Value 0
		return InitializeVarintZero();
	}
	auto int_value_char = value.GetData();
	idx_t actual_size = end_pos - start_pos;

	// we initalize result with space for our header
	string result(VARINT_HEADER_SIZE, '0');
	unsafe_vector<uint64_t> digits;

	// The max number a uint64_t can represent is 18.446.744.073.709.551.615
	// That has 20 digits
	// In the worst case a remainder of a division will be 255, which is 3 digits
	// Since the max value is 184, we need to take one more digit out
	// Hence we end up with a max of 16 digits supported.
	constexpr uint8_t max_digits = 16;
	const idx_t number_of_digits = static_cast<idx_t>(std::ceil(static_cast<double>(actual_size) / max_digits));

	// lets convert the string to a uint64_t vector
	idx_t cur_end = end_pos;
	for (idx_t i = 0; i < number_of_digits; i++) {
		idx_t cur_start = static_cast<int64_t>(start_pos) > static_cast<int64_t>(cur_end - max_digits)
		                      ? start_pos
		                      : cur_end - max_digits;
		std::string current_number(int_value_char + cur_start, cur_end - cur_start);
		digits.push_back(std::stoull(current_number));
		// move cur_end to more digits down the road
		cur_end = cur_end - max_digits;
	}

	// Now that we have our uint64_t vector, lets start our division process to figure out the new number and remainder
	while (!digits.empty()) {
		idx_t digit_idx = digits.size() - 1;
		uint8_t remainder = 0;
		idx_t digits_size = digits.size();
		for (idx_t i = 0; i < digits_size; i++) {
			digits[digit_idx] += static_cast<uint64_t>(remainder * pow(10, max_digits));
			remainder = static_cast<uint8_t>(digits[digit_idx] % 256);
			digits[digit_idx] /= 256;
			if (digits[digit_idx] == 0 && digit_idx == digits.size() - 1) {
				// we can cap this
				digits.pop_back();
			}
			digit_idx--;
		}
		if (is_negative) {
			result.push_back(static_cast<char>(~remainder));
		} else {
			result.push_back(static_cast<char>(remainder));
		}
	}
	std::reverse(result.begin() + VARINT_HEADER_SIZE, result.end());
	// Set header after we know the size of the varint
	SetHeader(&result[0], result.size() - VARINT_HEADER_SIZE, is_negative);
	return result;
}